

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionFuncs.cpp
# Opt level: O1

void __thiscall
slang::ast::builtins::BitsToRealFunction::BitsToRealFunction
          (BitsToRealFunction *this,Builtins *builtins)

{
  initializer_list<const_slang::ast::Type_*> __l;
  allocator_type local_39;
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> local_38;
  Type *local_20;
  
  local_20 = (Type *)&builtins->ulongIntType;
  __l._M_len = 1;
  __l._M_array = &local_20;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            (&local_38,__l,&local_39);
  SimpleSystemSubroutine::SimpleSystemSubroutine
            (&this->super_SimpleSystemSubroutine,BitsToReal,Function,1,&local_38,
             &(builtins->realType).super_Type,false,false);
  if (local_38.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.
                    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  (this->super_SimpleSystemSubroutine).super_SystemSubroutine._vptr_SystemSubroutine =
       (_func_int **)&PTR__SimpleSystemSubroutine_005e0410;
  return;
}

Assistant:

explicit BitsToRealFunction(const Builtins& builtins) :
        SimpleSystemSubroutine(KnownSystemName::BitsToReal, SubroutineKind::Function, 1,
                               {&builtins.ulongIntType}, builtins.realType, false) {}